

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O0

void __thiscall TasGrid::GridSequence::loadGpuSurpluses<float>(GridSequence *this)

{
  AccelerationContext *acc;
  bool bVar1;
  pointer pCVar2;
  const_iterator ibegin;
  const_iterator iend;
  unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  local_20;
  unique_ptr *local_18;
  unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  *ccache;
  GridSequence *this_local;
  
  ccache = (unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            *)this;
  local_18 = (unique_ptr *)getGpuCache<float>(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    Utils::make_unique<TasGrid::CudaSequenceData<float>>();
    std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::operator=((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 *)local_18,&local_20);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&local_20);
  }
  pCVar2 = std::
           unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
           ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                         *)local_18);
  bVar1 = GpuVector<float>::empty(&pCVar2->surpluses);
  if (bVar1) {
    pCVar2 = std::
             unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                           *)local_18);
    acc = (this->super_BaseCanonicalGrid).acceleration;
    ibegin = Data2D<double>::begin(&this->surpluses);
    iend = Data2D<double>::end(&this->surpluses);
    GpuVector<float>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&pCVar2->surpluses,acc,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               ibegin._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               iend._M_current);
  }
  return;
}

Assistant:

void loadGpuSurpluses() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (ccache->surpluses.empty()) ccache->surpluses.load(acceleration, surpluses.begin(), surpluses.end());
    }